

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

void __thiscall MidiOutApi::MidiOutApi(MidiOutApi *this)

{
  (this->super_MidiApi).apiData_ = (void *)0x0;
  (this->super_MidiApi).connected_ = false;
  (this->super_MidiApi).errorString_._M_dataplus._M_p =
       (pointer)&(this->super_MidiApi).errorString_.field_2;
  (this->super_MidiApi).errorString_._M_string_length = 0;
  (this->super_MidiApi).errorString_.field_2._M_local_buf[0] = '\0';
  (this->super_MidiApi).errorCallback_ = (RtMidiErrorCallback)0x0;
  (this->super_MidiApi).firstErrorOccurred_ = false;
  (this->super_MidiApi).errorCallbackUserData_ = (void *)0x0;
  (this->super_MidiApi)._vptr_MidiApi = (_func_int **)&PTR__MidiOutApi_00115b60;
  return;
}

Assistant:

MidiOutApi :: MidiOutApi( void )
  : MidiApi()
{
}